

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall cfd::js::api::json::FundPsbtRequest::~FundPsbtRequest(FundPsbtRequest *this)

{
  pointer pcVar1;
  
  (this->super_JsonClassBase<cfd::js::api::json::FundPsbtRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__FundPsbtRequest_00a830b0;
  FundFeeInformation::~FundFeeInformation(&this->fee_info_);
  pcVar1 = (this->reserved_descriptor_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->reserved_descriptor_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->network_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->network_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  vector<cfd::js::api::json::FundUtxoJsonData,_std::allocator<cfd::js::api::json::FundUtxoJsonData>_>
  ::~vector(&(this->utxos_).super_JsonVector<cfd::js::api::json::FundUtxoJsonData>.
             super_vector<cfd::js::api::json::FundUtxoJsonData,_std::allocator<cfd::js::api::json::FundUtxoJsonData>_>
           );
  pcVar1 = (this->psbt_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->psbt_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->ignore_items)._M_t);
  return;
}

Assistant:

virtual ~FundPsbtRequest() {
    // do nothing
  }